

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O3

int Curl_llist_move(curl_llist *list,curl_llist_element *e,curl_llist *to_list,
                   curl_llist_element *to_e)

{
  size_t sVar1;
  int iVar2;
  curl_llist *pcVar3;
  curl_llist_element **ppcVar4;
  curl_llist_element *pcVar5;
  curl_llist *pcVar6;
  
  iVar2 = 0;
  if ((e != (curl_llist_element *)0x0) && (sVar1 = list->size, sVar1 != 0)) {
    pcVar3 = (curl_llist *)e->next;
    if (list->head == e) {
      pcVar5 = (curl_llist_element *)0x0;
      pcVar6 = list;
    }
    else {
      pcVar5 = e->prev;
      pcVar6 = (curl_llist *)&pcVar5->next;
    }
    pcVar6->head = (curl_llist_element *)pcVar3;
    if (pcVar3 == (curl_llist *)0x0) {
      pcVar3 = list;
    }
    pcVar3->tail = pcVar5;
    list->size = sVar1 - 1;
    sVar1 = to_list->size;
    if (sVar1 == 0) {
      to_list->head = e;
      ppcVar4 = &to_list->tail;
      e->prev = (curl_llist_element *)0x0;
      e->next = (curl_llist_element *)0x0;
    }
    else {
      ppcVar4 = &to_e->next;
      pcVar3 = (curl_llist *)to_e->next;
      e->next = (curl_llist_element *)pcVar3;
      e->prev = to_e;
      if (pcVar3 == (curl_llist *)0x0) {
        pcVar3 = to_list;
      }
      pcVar3->tail = e;
    }
    *ppcVar4 = e;
    to_list->size = sVar1 + 1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Curl_llist_move(struct curl_llist *list, struct curl_llist_element *e,
                    struct curl_llist *to_list,
                    struct curl_llist_element *to_e)
{
  /* Remove element from list */
  if(e == NULL || list->size == 0)
    return 0;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    e->prev->next = e->next;
    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  --list->size;

  /* Add element to to_list after to_e */
  if(to_list->size == 0) {
    to_list->head = e;
    to_list->head->prev = NULL;
    to_list->head->next = NULL;
    to_list->tail = e;
  }
  else {
    e->next = to_e->next;
    e->prev = to_e;
    if(to_e->next) {
      to_e->next->prev = e;
    }
    else {
      to_list->tail = e;
    }
    to_e->next = e;
  }

  ++to_list->size;

  return 1;
}